

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_glow.cpp
# Opt level: O2

int gl_CheckSpriteGlow(sector_t *sec,int lightlevel,DVector3 *pos)

{
  uint uVar1;
  int iVar2;
  FTexture *pFVar3;
  double dVar4;
  double dVar5;
  DVector2 local_28;
  
  uVar1 = sec->planes[0].Texture.texnum;
  if (((uVar1 < TexMan.Textures.Count) &&
      (pFVar3 = TexMan.Textures.Array[(int)uVar1].Texture, pFVar3 != (FTexture *)0x0)) &&
     (((pFVar3->gl_info).field_0x4c & 4) != 0)) {
    dVar5 = pos->Z;
    local_28.X = pos->X;
    local_28.Y = pos->Y;
    dVar4 = secplane_t::ZatPoint(&sec->floorplane,&local_28);
    iVar2 = (pFVar3->gl_info).GlowHeight;
    if (iVar2 != 0) {
      dVar5 = dVar5 - dVar4;
      dVar4 = (double)iVar2;
      if (dVar5 < dVar4) {
        dVar5 = dVar5 / dVar4;
        dVar4 = 0.0;
        if (0.0 <= dVar5) {
          dVar4 = dVar5;
        }
        dVar5 = (double)(lightlevel + 0xff >> 1);
        lightlevel = (int)(((double)lightlevel - dVar5) * dVar4 + dVar5);
      }
    }
  }
  return lightlevel;
}

Assistant:

int gl_CheckSpriteGlow(sector_t *sec, int lightlevel, const DVector3 &pos)
{
	FTextureID floorpic = sec->GetTexture(sector_t::floor);
	FTexture *tex = TexMan[floorpic];
	if (tex != NULL && tex->isGlowing())
	{
		double floordiff = pos.Z - sec->floorplane.ZatPoint(pos);
		if (floordiff < tex->gl_info.GlowHeight && tex->gl_info.GlowHeight != 0)
		{
			int maxlight = (255 + lightlevel) >> 1;
			double lightfrac = floordiff / tex->gl_info.GlowHeight;
			if (lightfrac < 0) lightfrac = 0;
			lightlevel = int(lightfrac*lightlevel + maxlight*(1 - lightfrac));
		}
	}
	return lightlevel;
}